

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynBase * ParseArithmetic(ParseContext *ctx)

{
  SmallArray<SynBinaryOpElement,_32U> *this;
  uint uVar1;
  LexemeType type;
  SynBinaryOpType SVar2;
  Lexeme *begin;
  Lexeme *pLVar3;
  SynBinaryOpType SVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  SynBase *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *pSVar8;
  uint uVar9;
  SynBinaryOpElement *pSVar10;
  SynBase *pSVar11;
  undefined4 extraout_var_01;
  
  this_00 = ParseTerminal(ctx);
  if (this_00 == (SynBase *)0x0) {
    this_00 = (SynBase *)0x0;
  }
  else {
    this = &ctx->binaryOpStack;
    uVar1 = (ctx->binaryOpStack).count;
    do {
      begin = ctx->currentLexeme;
      type = begin->type;
      SVar4 = GetBinaryOpType(type);
      if (SVar4 != SYN_BINARY_OP_UNKNOWN) {
        if (type != lex_none) {
          ctx->currentLexeme = begin + 1;
        }
        uVar9 = (ctx->binaryOpStack).count;
        if (uVar1 < uVar9) {
          uVar5 = GetBinaryOpPrecedence(SVar4);
          pSVar11 = this_00;
          do {
            pSVar10 = this->data;
            uVar6 = GetBinaryOpPrecedence(pSVar10[uVar9 - 1].type);
            this_00 = pSVar11;
            if (uVar5 < uVar6) break;
            pSVar10 = pSVar10 + (uVar9 - 1);
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
            this_00 = (SynBase *)CONCAT44(extraout_var,iVar7);
            SVar2 = pSVar10->type;
            pSVar8 = pSVar10->value;
            SynBase::SynBase(this_00,0x30,pSVar10->begin,pSVar10->end);
            this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_00228998;
            *(SynBinaryOpType *)&this_00->field_0x3c = SVar2;
            this_00[1]._vptr_SynBase = (_func_int **)pSVar8;
            *(SynBase **)&this_00[1].typeID = pSVar11;
            uVar9 = (ctx->binaryOpStack).count;
            if (uVar9 == 0) goto LAB_001154c0;
            uVar9 = uVar9 - 1;
            (ctx->binaryOpStack).count = uVar9;
            pSVar11 = this_00;
          } while (uVar1 < uVar9);
        }
        pLVar3 = ctx->currentLexeme;
        if (pLVar3 <= ctx->firstLexeme) {
LAB_001154df:
          __assert_fail("currentLexeme > firstLexeme",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                        ,0x19c,"Lexeme *ParseContext::Previous()");
        }
        if (uVar9 == (ctx->binaryOpStack).max) {
          SmallArray<SynBinaryOpElement,_32U>::grow(this,uVar9);
        }
        pSVar10 = this->data;
        if (pSVar10 == (SynBinaryOpElement *)0x0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<SynBinaryOpElement, 32>::push_back(const T &) [T = SynBinaryOpElement, N = 32]"
                       );
        }
        uVar9 = (ctx->binaryOpStack).count;
        (ctx->binaryOpStack).count = uVar9 + 1;
        pSVar10[uVar9].begin = begin;
        pSVar10[uVar9].end = pLVar3 + -1;
        pSVar10[uVar9].type = SVar4;
        pSVar10[uVar9].value = this_00;
        this_00 = ParseTerminal(ctx);
        if (this_00 == (SynBase *)0x0) {
          anon_unknown.dwarf_1613e::Report
                    (ctx,ctx->currentLexeme,"ERROR: expression not found after binary operation");
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])();
          this_00 = (SynBase *)CONCAT44(extraout_var_00,iVar7);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001154df;
          SynBase::SynBase(this_00,0,begin,ctx->currentLexeme + -1);
          this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_002283e8;
        }
      }
    } while (SVar4 != SYN_BINARY_OP_UNKNOWN);
    uVar9 = (ctx->binaryOpStack).count;
    while (uVar1 < uVar9) {
      pSVar10 = (ctx->binaryOpStack).data;
      uVar9 = uVar9 - 1;
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar8 = (SynBase *)CONCAT44(extraout_var_01,iVar7);
      SVar4 = pSVar10[uVar9].type;
      pSVar11 = pSVar10[uVar9].value;
      SynBase::SynBase(pSVar8,0x30,pSVar10[uVar9].begin,pSVar10[uVar9].end);
      pSVar8->_vptr_SynBase = (_func_int **)&PTR__SynBase_00228998;
      *(SynBinaryOpType *)&pSVar8->field_0x3c = SVar4;
      pSVar8[1]._vptr_SynBase = (_func_int **)pSVar11;
      *(SynBase **)&pSVar8[1].typeID = this_00;
      uVar9 = (ctx->binaryOpStack).count;
      if (uVar9 == 0) {
LAB_001154c0:
        __assert_fail("count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x183,
                      "void SmallArray<SynBinaryOpElement, 32>::pop_back() [T = SynBinaryOpElement, N = 32]"
                     );
      }
      uVar9 = uVar9 - 1;
      (ctx->binaryOpStack).count = uVar9;
      this_00 = pSVar8;
    }
  }
  return this_00;
}

Assistant:

SynBase* ParseArithmetic(ParseContext &ctx)
{
	SynBase *lhs = ParseTerminal(ctx);

	if(!lhs)
		return NULL;

	unsigned startSize = ctx.binaryOpStack.size();

	while(SynBinaryOpType binaryOp = GetBinaryOpType(ctx.Peek()))
	{
		Lexeme *start = ctx.currentLexeme;

		ctx.Skip();

		while(ctx.binaryOpStack.size() > startSize && GetBinaryOpPrecedence(ctx.binaryOpStack.back().type) <= GetBinaryOpPrecedence(binaryOp))
		{
			SynBinaryOpElement &lastOp = ctx.binaryOpStack.back();

			lhs = new (ctx.get<SynBinaryOp>()) SynBinaryOp(lastOp.begin, lastOp.end, lastOp.type, lastOp.value, lhs);

			ctx.binaryOpStack.pop_back();
		}

		ctx.binaryOpStack.push_back(SynBinaryOpElement(start, ctx.Previous(), binaryOp, lhs));

		lhs = ParseTerminal(ctx);

		if(!lhs)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after binary operation");

			lhs = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
		}
	}

	while(ctx.binaryOpStack.size() > startSize)
	{
		SynBinaryOpElement &lastOp = ctx.binaryOpStack.back();

		lhs = new (ctx.get<SynBinaryOp>()) SynBinaryOp(lastOp.begin, lastOp.end, lastOp.type, lastOp.value, lhs);

		ctx.binaryOpStack.pop_back();
	}

	return lhs;
}